

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O1

bool read_dib_body(QDataStream *s,BMP_INFOHDR *bi,qint64 datapos,qint64 startpos,QImage *image)

{
  uint *puVar1;
  ushort uVar2;
  Representation RVar3;
  long *plVar4;
  byte bVar5;
  Representation RVar6;
  byte bVar7;
  byte bVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  QRgb QVar12;
  QRgb QVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  qsizetype qVar17;
  uchar *__s;
  long lVar18;
  ushort *puVar19;
  byte *pbVar20;
  ulong uVar21;
  void *__dest;
  quint32 qVar22;
  int colorCount;
  uint *puVar23;
  byte *pbVar24;
  long lVar25;
  int i;
  uint uVar26;
  int iVar27;
  byte *pbVar28;
  byte *pbVar29;
  Format format;
  byte bVar30;
  QSize size;
  ushort *puVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uchar *puVar36;
  uint uVar37;
  uint uVar38;
  uchar *__s_00;
  ulong uVar39;
  long in_FS_OFFSET;
  bool bVar40;
  uint result_2;
  uint result_1;
  uint result_3;
  uint result;
  char tmp;
  uint alpha_mask;
  uint blue_mask;
  uint green_mask;
  uint red_mask;
  quint8 b;
  uint local_f0;
  uint local_e8;
  ulong local_e0;
  ulong local_d8;
  int local_c8;
  quint32 local_4c;
  quint32 local_48;
  quint32 local_44;
  quint32 local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar4 = *(long **)(s + 8);
  cVar9 = (**(code **)(*plVar4 + 0x90))(plVar4);
  bVar10 = false;
  if (cVar9 != '\0') goto LAB_0026dc0a;
  iVar27 = bi->biSize;
  RVar3.m_i = bi->biWidth;
  uVar26 = bi->biHeight;
  uVar2 = bi->biBitCount;
  iVar11 = bi->biCompression;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  cVar9 = (**(code **)(*plVar4 + 0x60))();
  if (cVar9 == '\0') {
    (**(code **)(*plVar4 + 0x88))(plVar4,bi->biSize + startpos);
  }
  uVar37 = iVar11 - 3;
  if (bi->biSize < 0x6c) {
    if (1 < uVar37) goto LAB_0026cdfa;
    if (((uVar2 != 0x20) && (uVar2 != 0x10)) ||
       (((lVar15 = QIODevice::read((char *)plVar4,(longlong)&local_40), lVar15 == 4 &&
         ((lVar15 = QIODevice::read((char *)plVar4,(longlong)&local_44), lVar15 == 4 &&
          (lVar15 = QIODevice::read((char *)plVar4,(longlong)&local_48), lVar15 == 4)))) &&
        ((iVar11 != 4 || (lVar15 = QIODevice::read((char *)plVar4,(longlong)&local_4c), lVar15 == 4)
         ))))) goto LAB_0026cd38;
  }
  else {
    local_40 = bi->biRedMask;
    local_44 = bi->biGreenMask;
    local_48 = bi->biBlueMask;
    local_4c = bi->biAlphaMask;
LAB_0026cd38:
    bVar40 = true;
    if (1 < uVar37) {
LAB_0026cdfa:
      if (uVar2 == 0x20 && iVar11 == 0) {
        bVar40 = local_4c == 0xff000000;
      }
      else {
        bVar40 = false;
      }
    }
    bVar10 = false;
    if (0x20 < uVar2) goto LAB_0026dc0a;
    bVar30 = bVar40 & local_4c != 0;
    uVar16 = (ulong)(uint)uVar2;
    if ((0x101010000U >> (uVar16 & 0x3f) & 1) == 0) {
      format = Format_Indexed8;
      if ((0x110UL >> (uVar16 & 0x3f) & 1) == 0) {
        if (uVar16 != 1) goto LAB_0026dc0a;
        format = Format_Mono;
        bVar10 = false;
      }
    }
    else {
      format = bVar30 | Format_RGB32;
      bVar10 = true;
    }
    colorCount = 0;
    if (!bVar10) {
      colorCount = 1 << ((byte)uVar2 & 0x1f);
      if (bi->biClrUsed != 0) {
        colorCount = bi->biClrUsed;
      }
      if (colorCount - 0x101U < 0xffffff00) goto LAB_0026dc07;
    }
    RVar6.m_i = -uVar26;
    if (-1 < bi->biHeight) {
      RVar6.m_i = uVar26;
    }
    local_e0 = (ulong)(uint)RVar6.m_i;
    size.ht.m_i = RVar6.m_i;
    size.wd.m_i = RVar3.m_i;
    bVar10 = QImageIOHandler::allocateImage(size,format,image);
    if (bVar10) {
      if (colorCount < 1) {
        if ((uVar37 < 2) && ((uVar2 == 0x20 || (uVar2 == 0x10)))) {
          bVar7 = 0;
          for (qVar22 = local_40; (0xff < qVar22 || ((qVar22 != 0 && ((qVar22 & 1) == 0))));
              qVar22 = qVar22 >> 1) {
            bVar7 = bVar7 + 1;
          }
          uVar26 = local_40 >> (bVar7 & 0x1f);
          if (uVar26 != 0xffffffff) {
            uVar37 = 8;
            if (local_40 >> (bVar7 & 0x1f) != 0) {
              uVar14 = 8;
              do {
                uVar37 = uVar14 - 1;
                if (uVar26 < 2) break;
                uVar26 = uVar26 >> 1;
                bVar10 = uVar14 != 1;
                uVar14 = uVar37;
              } while (bVar10);
            }
            bVar8 = 0;
            for (qVar22 = local_44; (0xff < qVar22 || ((qVar22 != 0 && ((qVar22 & 1) == 0))));
                qVar22 = qVar22 >> 1) {
              bVar8 = bVar8 + 1;
            }
            uVar26 = local_44 >> (bVar8 & 0x1f);
            if (uVar26 != 0xffffffff) {
              uVar14 = 8;
              if (local_44 >> (bVar8 & 0x1f) != 0) {
                uVar38 = 8;
                do {
                  uVar14 = uVar38 - 1;
                  if (uVar26 < 2) break;
                  uVar26 = uVar26 >> 1;
                  bVar10 = uVar38 != 1;
                  uVar38 = uVar14;
                } while (bVar10);
              }
              local_f0 = 0;
              for (qVar22 = local_48; (0xff < qVar22 || ((qVar22 != 0 && ((qVar22 & 1) == 0))));
                  qVar22 = qVar22 >> 1) {
                local_f0 = local_f0 + 1;
              }
              bVar5 = (byte)local_f0 & 0x1f;
              uVar26 = local_48 >> bVar5;
              if (uVar26 != 0xffffffff) {
                uVar38 = 8;
                if (local_48 >> bVar5 != 0) {
                  uVar32 = 8;
                  do {
                    uVar38 = uVar32 - 1;
                    if (uVar26 < 2) break;
                    uVar26 = uVar26 >> 1;
                    bVar10 = uVar32 != 1;
                    uVar32 = uVar38;
                  } while (bVar10);
                }
                bVar5 = 0;
                for (qVar22 = local_4c; (0xff < qVar22 || ((qVar22 != 0 && ((qVar22 & 1) == 0))));
                    qVar22 = qVar22 >> 1) {
                  bVar5 = bVar5 + 1;
                }
                uVar26 = local_4c >> (bVar5 & 0x1f);
                if (uVar26 != 0xffffffff) {
                  if (local_4c >> (bVar5 & 0x1f) == 0) {
                    local_e8 = 8;
                  }
                  else {
                    uVar32 = 8;
                    do {
                      local_e8 = uVar32 - 1;
                      if (uVar26 < 2) break;
                      uVar26 = uVar26 >> 1;
                      bVar10 = uVar32 != 1;
                      uVar32 = local_e8;
                    } while (bVar10);
                  }
                  goto LAB_0026d267;
                }
              }
            }
          }
          goto LAB_0026dc07;
        }
        if ((iVar11 == 0) && ((uVar2 == 0x20 || (uVar2 == 0x18)))) {
          local_48 = 0xff;
          local_44 = 0xff00;
          local_40 = 0xff0000;
          bVar7 = 0x10;
          if (bVar30 == 0) {
            bVar8 = 8;
            uVar38 = 0;
            uVar14 = 0;
            uVar37 = 0;
            goto LAB_0026d257;
          }
          bVar5 = 0;
          for (qVar22 = local_4c; (0xff < qVar22 || ((qVar22 != 0 && ((qVar22 & 1) == 0))));
              qVar22 = qVar22 >> 1) {
            bVar5 = bVar5 + 1;
          }
          uVar37 = local_4c >> (bVar5 & 0x1f);
          if (uVar37 == 0xffffffff) goto LAB_0026dc07;
          if (local_4c >> (bVar5 & 0x1f) == 0) {
            local_e8 = 8;
            bVar8 = 8;
            uVar38 = uVar37;
            local_f0 = uVar37;
            uVar14 = uVar37;
            goto LAB_0026d267;
          }
          bVar8 = 8;
          uVar26 = 8;
          do {
            local_e8 = uVar26 - 1;
            if (uVar37 < 2) break;
            uVar37 = uVar37 >> 1;
            bVar10 = uVar26 != 1;
            uVar26 = local_e8;
          } while (bVar10);
          uVar14 = 0;
          uVar38 = 0;
          uVar37 = 0;
        }
        else {
          if (uVar2 != 0x10 || iVar11 != 0) goto LAB_0026d055;
          local_48 = 0x1f;
          local_44 = 0x3e0;
          local_40 = 0x7c00;
          bVar7 = 10;
          bVar8 = 5;
          uVar38 = 3;
          uVar14 = 3;
          uVar37 = 3;
LAB_0026d257:
          local_e8 = 0;
          bVar5 = 0;
        }
        local_f0 = 0;
      }
      else {
        QImage::setColorCount(image,colorCount);
        local_3c = 0xaaaaaaaa;
        i = 0;
        do {
          lVar15 = QIODevice::read((char *)plVar4,(longlong)&local_3c);
          if (lVar15 != (ulong)(iVar27 != 0xc) + 3) goto LAB_0026dc07;
          QImage::setColor(image,i,(local_3c >> 8 & 0xff) << 8 | (local_3c >> 0x10 & 0xff) << 0x10 |
                                   local_3c & 0xff | 0xff000000);
          cVar9 = (**(code **)(*plVar4 + 0x90))(plVar4);
          if (cVar9 != '\0') goto LAB_0026dc07;
          i = i + 1;
        } while (colorCount != i);
LAB_0026d055:
        local_e8 = 0;
        uVar37 = 0;
        bVar5 = 0;
        local_f0 = 0;
        bVar8 = 0;
        bVar7 = 0;
        uVar38 = 0;
        uVar14 = 0;
      }
LAB_0026d267:
      uVar16 = (ulong)RVar3.m_i;
      QImage::setDotsPerMeterX(image,bi->biXPelsPerMeter);
      QImage::setDotsPerMeterY(image,bi->biYPelsPerMeter);
      if (((-1 < datapos) && (lVar15 = (**(code **)(*plVar4 + 0x78))(plVar4), lVar15 < datapos)) &&
         (cVar9 = (**(code **)(*plVar4 + 0x60))(plVar4), cVar9 == '\0')) {
        (**(code **)(*plVar4 + 0x88))(plVar4);
      }
      qVar17 = QImage::bytesPerLine(image);
      __s = QImage::bits(image);
      local_c8 = (int)qVar17;
      if (uVar2 < 0x10) {
        if (uVar2 == 1) {
          lVar25 = (long)local_c8;
          puVar36 = __s + ((long)RVar6.m_i + -1) * lVar25;
          lVar15 = (long)RVar6.m_i + 1;
          do {
            if (lVar15 + -1 == 0 || lVar15 < 1) break;
            lVar18 = QIODevice::read((char *)plVar4,(longlong)puVar36);
            puVar36 = puVar36 + -lVar25;
            lVar15 = lVar15 + -1;
          } while (lVar18 == lVar25);
          if (colorCount == 2) {
            QVar12 = QImage::color(image,0);
            QVar13 = QImage::color(image,1);
            if ((QVar12 & 0xff) * 5 + (QVar12 >> 4 & 0xff0) + (QVar12 >> 0x10 & 0xff) * 0xb >> 5 <
                (QVar13 & 0xff) * 5 + (QVar13 >> 4 & 0xff0) + (QVar13 >> 0x10 & 0xff) * 0xb >> 5) {
              swapPixel01(image);
            }
          }
        }
        else if (uVar2 == 4) {
          iVar27 = RVar3.m_i + 0xe;
          if (-1 < (int)(RVar3.m_i + 7U)) {
            iVar27 = RVar3.m_i + 7U;
          }
          uVar39 = (ulong)((iVar27 >> 3) << 2);
          pbVar20 = (byte *)operator_new__(uVar39);
          if (iVar11 == 0) {
            memset(__s,0,(long)(RVar6.m_i * local_c8));
            if (0 < RVar6.m_i) {
              do {
                uVar21 = QIODevice::read((char *)plVar4,(longlong)pbVar20);
                if (uVar21 != uVar39) break;
                pbVar24 = __s + (local_e0 - 1) * (long)local_c8;
                pbVar28 = pbVar20;
                iVar27 = (int)(((uint)(uVar16 >> 0x1f) & 1) + RVar3.m_i) >> 1;
                if (1 < RVar3.m_i) {
                  do {
                    *pbVar24 = *pbVar28 >> 4;
                    bVar30 = *pbVar28;
                    pbVar28 = pbVar28 + 1;
                    pbVar24[1] = bVar30 & 0xf;
                    pbVar24 = pbVar24 + 2;
                    iVar27 = iVar27 + -1;
                  } while (iVar27 != 0);
                }
                if ((RVar3.m_i & 1U) != 0) {
                  *pbVar24 = *pbVar28 >> 4;
                }
                bVar10 = 1 < (long)local_e0;
                local_e0 = local_e0 - 1;
              } while (bVar10);
            }
          }
          else if (iVar11 == 2) {
            local_3c = CONCAT31(local_3c._1_3_,0xaa);
            if (0 < RVar6.m_i) {
              pbVar28 = __s + (int)((RVar6.m_i - 1U) * local_c8);
              pbVar24 = pbVar28 + uVar16;
              local_d8 = 0;
              uVar26 = 0;
              do {
                cVar9 = QIODevice::getChar((char *)plVar4);
                if (cVar9 == '\0') break;
                if ((ulong)(byte)local_3c == 0) {
                  bVar30 = QIODevice::getChar((char *)plVar4);
                  uVar16 = local_e0;
                  if (((byte)local_3c != 1 & bVar30) == 1) {
                    iVar27 = (int)local_d8;
                    if ((ulong)(byte)local_3c == 2) {
                      QIODevice::getChar((char *)plVar4);
                      uVar26 = uVar26 + 0xaa;
                      QIODevice::getChar((char *)plVar4);
                      if ((uint)RVar3.m_i <= uVar26) {
                        uVar26 = RVar3.m_i - 1;
                      }
                      uVar37 = iVar27 + 0xaaU;
                      if ((uint)RVar6.m_i <= iVar27 + 0xaaU) {
                        uVar37 = RVar6.m_i - 1U;
                      }
                      pbVar28 = __s + (long)(int)((~uVar37 + RVar6.m_i) * local_c8) +
                                      (long)(int)uVar26;
                      uVar16 = (ulong)uVar37;
                    }
                    else if ((byte)local_3c == 0) {
                      pbVar28 = __s + (int)(((RVar6.m_i - 2U) - iVar27) * local_c8);
                      uVar26 = 0;
                      uVar16 = (ulong)(iVar27 + 1);
                    }
                    else {
                      if (pbVar24 < pbVar28 + (byte)local_3c) {
                        local_3c = CONCAT31(local_3c._1_3_,(char)pbVar24 - (char)pbVar28);
                      }
                      uVar37 = local_3c;
                      if (1 < (byte)local_3c) {
                        uVar14 = (uint)((byte)local_3c >> 1);
                        pbVar29 = pbVar28;
                        do {
                          QIODevice::getChar((char *)plVar4);
                          *pbVar29 = (byte)local_3c >> 4;
                          pbVar28 = pbVar29 + 2;
                          pbVar29[1] = (byte)local_3c & 0xf;
                          uVar14 = uVar14 - 1;
                          pbVar29 = pbVar28;
                        } while (uVar14 != 0);
                      }
                      if ((uVar37 & 1) != 0) {
                        QIODevice::getChar((char *)plVar4);
                        *pbVar28 = 10;
                        pbVar28 = pbVar28 + 1;
                      }
                      uVar37 = uVar37 & 0xff;
                      if ((uVar37 + 1 & 2) != 0) {
                        QIODevice::getChar((char *)plVar4);
                      }
                      uVar26 = uVar26 + uVar37;
                      uVar16 = local_d8;
                    }
                  }
                }
                else {
                  if (pbVar24 < pbVar28 + (byte)local_3c) {
                    local_3c = CONCAT31(local_3c._1_3_,(char)pbVar24 - (char)pbVar28);
                  }
                  uVar37 = local_3c;
                  bVar30 = (byte)local_3c;
                  QIODevice::getChar((char *)plVar4);
                  if (1 < bVar30) {
                    uVar14 = (uint)(bVar30 >> 1);
                    pbVar29 = pbVar28;
                    do {
                      *pbVar29 = (byte)local_3c >> 4;
                      pbVar28 = pbVar29 + 2;
                      pbVar29[1] = (byte)local_3c & 0xf;
                      uVar14 = uVar14 - 1;
                      pbVar29 = pbVar28;
                    } while (uVar14 != 0);
                  }
                  if ((uVar37 & 1) != 0) {
                    *pbVar28 = (byte)local_3c >> 4;
                    pbVar28 = pbVar28 + 1;
                  }
                  uVar26 = uVar26 + (uVar37 & 0xff);
                  uVar16 = local_d8;
                }
                local_d8 = uVar16;
              } while ((int)local_d8 < RVar6.m_i);
            }
          }
          operator_delete__(pbVar20);
        }
        else if (uVar2 == 8) {
          if (iVar11 == 1) {
            local_3c = CONCAT31(local_3c._1_3_,0xaa);
            if (0 < RVar6.m_i) {
              __s_00 = __s + (int)((RVar6.m_i - 1U) * local_c8);
              puVar36 = __s_00 + uVar16;
              uVar26 = 0;
              uVar16 = 0;
              do {
                cVar9 = QIODevice::getChar((char *)plVar4);
                if (cVar9 == '\0') break;
                if ((ulong)(byte)local_3c == 0) {
                  bVar30 = QIODevice::getChar((char *)plVar4);
                  uVar39 = local_e0;
                  if (((byte)local_3c != 1 & bVar30) == 1) {
                    iVar27 = (int)uVar16;
                    if ((ulong)(byte)local_3c == 2) {
                      QIODevice::getChar((char *)plVar4);
                      uVar26 = uVar26 + 0xaa;
                      QIODevice::getChar((char *)plVar4);
                      if ((uint)RVar3.m_i <= uVar26) {
                        uVar26 = RVar3.m_i - 1;
                      }
                      uVar37 = iVar27 + 0xaaU;
                      if ((uint)RVar6.m_i <= iVar27 + 0xaaU) {
                        uVar37 = RVar6.m_i - 1U;
                      }
                      uVar16 = (ulong)uVar37;
                      uVar39 = (ulong)(int)((~uVar37 + RVar6.m_i) * local_c8);
                      __s_00 = __s + (int)uVar26;
                      goto LAB_0026dae5;
                    }
                    if ((byte)local_3c != 0) {
                      if (puVar36 < __s_00 + (byte)local_3c) {
                        local_3c = CONCAT31(local_3c._1_3_,(char)puVar36 - (char)__s_00);
                      }
                      uVar39 = QIODevice::read((char *)plVar4,(longlong)__s_00);
                      if (uVar39 == (byte)local_3c) {
                        if ((local_3c & 1) != 0) {
                          QIODevice::getChar((char *)plVar4);
                        }
                        goto LAB_0026dadb;
                      }
                      goto LAB_0026dc07;
                    }
                    __s_00 = __s + (int)(((RVar6.m_i - 2U) - iVar27) * local_c8);
                    uVar26 = 0;
                    uVar39 = (ulong)(iVar27 + 1);
                  }
                }
                else {
                  if (puVar36 < __s_00 + (byte)local_3c) {
                    local_3c = CONCAT31(local_3c._1_3_,(char)puVar36 - (char)__s_00);
                  }
                  QIODevice::getChar((char *)plVar4);
                  memset(__s_00,0xaa,(ulong)(byte)local_3c);
LAB_0026dadb:
                  uVar39 = (ulong)(byte)local_3c;
                  uVar26 = uVar26 + (local_3c & 0xff);
LAB_0026dae5:
                  __s_00 = __s_00 + uVar39;
                  uVar39 = uVar16;
                }
                uVar16 = uVar39;
              } while ((int)uVar39 < RVar6.m_i);
            }
          }
          else if (iVar11 == 0) {
            lVar25 = (long)local_c8;
            puVar36 = __s + ((long)RVar6.m_i + -1) * lVar25;
            lVar15 = (long)RVar6.m_i + 1;
            do {
              if (lVar15 + -1 == 0 || lVar15 < 1) break;
              lVar18 = QIODevice::read((char *)plVar4,(longlong)puVar36);
              puVar36 = puVar36 + -lVar25;
              lVar15 = lVar15 + -1;
            } while (lVar18 == lVar25);
          }
        }
      }
      else if (((uVar2 == 0x10) || (uVar2 == 0x18)) || (uVar2 == 0x20)) {
        puVar19 = (ushort *)operator_new__((long)local_c8);
        if (0 < RVar6.m_i) {
          iVar11 = RVar3.m_i * (short)uVar2;
          iVar27 = iVar11 + 0x1f;
          iVar11 = iVar11 + 0x3e;
          if (-1 < iVar27) {
            iVar11 = iVar27;
          }
          do {
            lVar15 = QIODevice::read((char *)plVar4,(longlong)puVar19);
            if (lVar15 != (iVar11 >> 5) << 2) break;
            if (0 < RVar3.m_i) {
              puVar23 = (uint *)(__s + (local_e0 - 1) * (long)local_c8);
              puVar1 = puVar23 + uVar16;
              puVar31 = puVar19;
              do {
                uVar26 = (uint)*puVar31;
                if (0x10 < (short)uVar2) {
                  uVar26 = (uint)CONCAT12((char)puVar31[1],*puVar31);
                }
                if (0x18 < (short)uVar2) {
                  uVar26 = uVar26 | (uint)*(byte *)((long)puVar31 + 3) << 0x18;
                }
                uVar32 = (local_40 & uVar26) >> (bVar7 & 0x1f);
                if ((uVar37 & 7) != 0) {
                  uVar32 = uVar32 << ((byte)uVar37 & 0x1f);
                  uVar34 = 8 - uVar37;
                  do {
                    uVar32 = uVar32 | uVar32 >> ((byte)uVar34 & 0x1f);
                    uVar34 = uVar34 * 2;
                  } while (uVar34 < 8);
                }
                uVar34 = (local_44 & uVar26) >> (bVar8 & 0x1f);
                if ((uVar14 & 7) != 0) {
                  uVar34 = uVar34 << ((byte)uVar14 & 0x1f);
                  uVar35 = 8 - uVar14;
                  do {
                    uVar34 = uVar34 | uVar34 >> ((byte)uVar35 & 0x1f);
                    uVar35 = uVar35 * 2;
                  } while (uVar35 < 8);
                }
                uVar35 = (local_48 & uVar26) >> ((byte)local_f0 & 0x1f);
                if ((uVar38 & 7) != 0) {
                  uVar35 = uVar35 << ((byte)uVar38 & 0x1f);
                  uVar33 = 8 - uVar38;
                  do {
                    uVar35 = uVar35 | uVar35 >> ((byte)uVar33 & 0x1f);
                    uVar33 = uVar33 * 2;
                  } while (uVar33 < 8);
                }
                uVar33 = 0xff;
                if (bVar30 != 0) {
                  uVar33 = (uVar26 & local_4c) >> (bVar5 & 0x1f);
                  if ((local_e8 & 7) != 0) {
                    uVar33 = uVar33 << ((byte)local_e8 & 0x1f);
                    uVar26 = 8 - local_e8;
                    do {
                      uVar33 = uVar33 | uVar33 >> ((byte)uVar26 & 0x1f);
                      uVar26 = uVar26 * 2;
                    } while (uVar26 < 8);
                  }
                }
                *puVar23 = uVar35 & 0xff |
                           (uVar34 & 0xff) << 8 | (uVar32 & 0xff) << 0x10 | uVar33 << 0x18;
                puVar23 = puVar23 + 1;
                puVar31 = (ushort *)((long)puVar31 + (ulong)((uint)(int)(short)uVar2 >> 3));
              } while (puVar23 < puVar1);
            }
            bVar10 = 1 < (long)local_e0;
            local_e0 = local_e0 - 1;
          } while (bVar10);
        }
        operator_delete__(puVar19);
      }
      uVar26 = bi->biHeight;
      bVar10 = true;
      if ((int)uVar26 < 0) {
        uVar16 = (ulong)local_c8;
        __dest = operator_new__(uVar16);
        if (uVar26 != 0xffffffff) {
          uVar39 = 1;
          if (1 < -((int)uVar26 / 2)) {
            uVar39 = (ulong)(uint)-((int)uVar26 / 2);
          }
          iVar27 = ~uVar26 * local_c8;
          puVar36 = __s;
          do {
            memcpy(__dest,puVar36,uVar16);
            memcpy(puVar36,__s + iVar27,uVar16);
            memcpy(__s + iVar27,__dest,uVar16);
            iVar27 = iVar27 - local_c8;
            puVar36 = puVar36 + local_c8;
            uVar39 = uVar39 - 1;
          } while (uVar39 != 0);
        }
        operator_delete__(__dest);
        bVar10 = true;
      }
      goto LAB_0026dc0a;
    }
  }
LAB_0026dc07:
  bVar10 = false;
LAB_0026dc0a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar10;
}

Assistant:

static bool read_dib_body(QDataStream &s, const BMP_INFOHDR &bi, qint64 datapos, qint64 startpos, QImage &image)
{
    QIODevice* d = s.device();
    if (d->atEnd())                                // end of stream/file
        return false;
#if 0
    qDebug("offset...........%lld", datapos);
    qDebug("startpos.........%lld", startpos);
    qDebug("biSize...........%d", bi.biSize);
    qDebug("biWidth..........%d", bi.biWidth);
    qDebug("biHeight.........%d", bi.biHeight);
    qDebug("biPlanes.........%d", bi.biPlanes);
    qDebug("biBitCount.......%d", bi.biBitCount);
    qDebug("biCompression....%d", bi.biCompression);
    qDebug("biSizeImage......%d", bi.biSizeImage);
    qDebug("biXPelsPerMeter..%d", bi.biXPelsPerMeter);
    qDebug("biYPelsPerMeter..%d", bi.biYPelsPerMeter);
    qDebug("biClrUsed........%d", bi.biClrUsed);
    qDebug("biClrImportant...%d", bi.biClrImportant);
#endif
    int w = bi.biWidth,         h = bi.biHeight,  nbits = bi.biBitCount;
    int t = bi.biSize,         comp = bi.biCompression;
    uint red_mask = 0;
    uint green_mask = 0;
    uint blue_mask = 0;
    uint alpha_mask = 0;
    uint red_shift = 0;
    uint green_shift = 0;
    uint blue_shift = 0;
    uint alpha_shift = 0;
    uint red_scale = 0;
    uint green_scale = 0;
    uint blue_scale = 0;
    uint alpha_scale = 0;
    bool bitfields = comp == BMP_BITFIELDS || comp == BMP_ALPHABITFIELDS;

    if (!d->isSequential())
        d->seek(startpos + bi.biSize); // goto start of colormap or masks

    if (bi.biSize >= BMP_WIN4) {
        red_mask = bi.biRedMask;
        green_mask = bi.biGreenMask;
        blue_mask = bi.biBlueMask;
        alpha_mask = bi.biAlphaMask;
    } else if (bitfields && (nbits == 16 || nbits == 32)) {
        if (d->read((char *)&red_mask, sizeof(red_mask)) != sizeof(red_mask))
            return false;
        if (d->read((char *)&green_mask, sizeof(green_mask)) != sizeof(green_mask))
            return false;
        if (d->read((char *)&blue_mask, sizeof(blue_mask)) != sizeof(blue_mask))
            return false;
        if (comp == BMP_ALPHABITFIELDS && d->read((char *)&alpha_mask, sizeof(alpha_mask)) != sizeof(alpha_mask))
            return false;
    }

    bool transp = bitfields || (comp == BMP_RGB && nbits == 32 && alpha_mask == 0xff000000);
    transp = transp && alpha_mask;

    int ncols = 0;
    int depth = 0;
    QImage::Format format;
    switch (nbits) {
        case 32:
        case 24:
        case 16:
            depth = 32;
            format = transp ? QImage::Format_ARGB32 : QImage::Format_RGB32;
            break;
        case 8:
        case 4:
            depth = 8;
            format = QImage::Format_Indexed8;
            break;
        case 1:
            depth = 1;
            format = QImage::Format_Mono;
            break;
        default:
            return false;
            break;
    }

    if (depth != 32) {
        ncols = bi.biClrUsed ? bi.biClrUsed : 1 << nbits;
        if (ncols < 1 || ncols > 256) // sanity check - don't run out of mem if color table is broken
            return false;
    }

    if (bi.biHeight < 0)
        h = -h;                  // support images with negative height

    if (!QImageIOHandler::allocateImage(QSize(w, h), format, &image))
        return false;
    if (ncols > 0) {                                // read color table
        image.setColorCount(ncols);
        uchar rgb[4];
        int   rgb_len = t == BMP_OLD ? 3 : 4;
        for (int i=0; i<ncols; i++) {
            if (d->read((char *)rgb, rgb_len) != rgb_len)
                return false;
            image.setColor(i, qRgb(rgb[2],rgb[1],rgb[0]));
            if (d->atEnd())                        // truncated file
                return false;
        }
    } else if (bitfields && (nbits == 16 || nbits == 32)) {
        red_shift = calc_shift(red_mask);
        if (((red_mask >> red_shift) + 1) == 0)
            return false;
        red_scale = calc_scale(red_mask >> red_shift);
        green_shift = calc_shift(green_mask);
        if (((green_mask >> green_shift) + 1) == 0)
            return false;
        green_scale = calc_scale(green_mask >> green_shift);
        blue_shift = calc_shift(blue_mask);
        if (((blue_mask >> blue_shift) + 1) == 0)
            return false;
        blue_scale = calc_scale(blue_mask >> blue_shift);
        alpha_shift = calc_shift(alpha_mask);
        if (((alpha_mask >> alpha_shift) + 1) == 0)
            return false;
        alpha_scale = calc_scale(alpha_mask >> alpha_shift);
    } else if (comp == BMP_RGB && (nbits == 24 || nbits == 32)) {
        blue_mask = 0x000000ff;
        green_mask = 0x0000ff00;
        red_mask = 0x00ff0000;
        blue_shift = 0;
        green_shift = 8;
        red_shift = 16;
        blue_scale = green_scale = red_scale = 0;
        if (transp) {
            alpha_shift = calc_shift(alpha_mask);
            if (((alpha_mask >> alpha_shift) + 1) == 0)
                return false;
            alpha_scale = calc_scale(alpha_mask >> alpha_shift);
        }
    } else if (comp == BMP_RGB && nbits == 16) {
        blue_mask = 0x001f;
        green_mask = 0x03e0;
        red_mask = 0x7c00;
        blue_shift = 0;
        green_shift = 5;
        red_shift = 10;
        blue_scale = green_scale = red_scale = 3;
    }

    image.setDotsPerMeterX(bi.biXPelsPerMeter);
    image.setDotsPerMeterY(bi.biYPelsPerMeter);

#if 0
    qDebug("Rmask: %08x Rshift: %08x Rscale:%08x", red_mask, red_shift, red_scale);
    qDebug("Gmask: %08x Gshift: %08x Gscale:%08x", green_mask, green_shift, green_scale);
    qDebug("Bmask: %08x Bshift: %08x Bscale:%08x", blue_mask, blue_shift, blue_scale);
    qDebug("Amask: %08x Ashift: %08x Ascale:%08x", alpha_mask, alpha_shift, alpha_scale);
#endif

    if (datapos >= 0 && datapos > d->pos()) {
        if (!d->isSequential())
            d->seek(datapos); // start of image data
    }

    int             bpl = image.bytesPerLine();
    uchar *data = image.bits();

    if (nbits == 1) {                                // 1 bit BMP image
        while (--h >= 0) {
            if (d->read((char*)(data + h*bpl), bpl) != bpl)
                break;
        }
        if (ncols == 2 && qGray(image.color(0)) < qGray(image.color(1)))
            swapPixel01(&image);                // pixel 0 is white!
    }

    else if (nbits == 4) {                        // 4 bit BMP image
        int    buflen = ((w+7)/8)*4;
        uchar *buf    = new uchar[buflen];
        if (comp == BMP_RLE4) {                // run length compression
            int x=0, y=0, c, i;
            quint8 b;
            uchar *p = data + (h-1)*bpl;
            const uchar *endp = p + w;
            while (y < h) {
                if (!d->getChar((char *)&b))
                    break;
                if (b == 0) {                        // escape code
                    if (!d->getChar((char *)&b) || b == 1) {
                        y = h;                // exit loop
                    } else switch (b) {
                        case 0:                        // end of line
                            x = 0;
                            y++;
                            p = data + (h-y-1)*bpl;
                            break;
                        case 2:                        // delta (jump)
                        {
                            quint8 tmp;
                            d->getChar((char *)&tmp);
                            x += tmp;
                            d->getChar((char *)&tmp);
                            y += tmp;
                        }

                            // Protection
                            if ((uint)x >= (uint)w)
                                x = w-1;
                            if ((uint)y >= (uint)h)
                                y = h-1;

                            p = data + (h-y-1)*bpl + x;
                            break;
                        default:                // absolute mode
                            // Protection
                            if (p + b > endp)
                                b = endp-p;

                            i = (c = b)/2;
                            while (i--) {
                                d->getChar((char *)&b);
                                *p++ = b >> 4;
                                *p++ = b & 0x0f;
                            }
                            if (c & 1) {
                                unsigned char tmp;
                                d->getChar((char *)&tmp);
                                *p++ = tmp >> 4;
                            }
                            if ((((c & 3) + 1) & 2) == 2)
                                d->getChar(nullptr);        // align on word boundary
                            x += c;
                    }
                } else {                        // encoded mode
                    // Protection
                    if (p + b > endp)
                        b = endp-p;

                    i = (c = b)/2;
                    d->getChar((char *)&b);                // 2 pixels to be repeated
                    while (i--) {
                        *p++ = b >> 4;
                        *p++ = b & 0x0f;
                    }
                    if (c & 1)
                        *p++ = b >> 4;
                    x += c;
                }
            }
        } else if (comp == BMP_RGB) {                // no compression
            memset(data, 0, h*bpl);
            while (--h >= 0) {
                if (d->read((char*)buf,buflen) != buflen)
                    break;
                uchar *p = data + h*bpl;
                uchar *b = buf;
                for (int i=0; i<w/2; i++) {        // convert nibbles to bytes
                    *p++ = *b >> 4;
                    *p++ = *b++ & 0x0f;
                }
                if (w & 1)                        // the last nibble
                    *p = *b >> 4;
            }
        }
        delete [] buf;
    }

    else if (nbits == 8) {                        // 8 bit BMP image
        if (comp == BMP_RLE8) {                // run length compression
            int x=0, y=0;
            quint8 b;
            uchar *p = data + (h-1)*bpl;
            const uchar *endp = p + w;
            while (y < h) {
                if (!d->getChar((char *)&b))
                    break;
                if (b == 0) {                        // escape code
                    if (!d->getChar((char *)&b) || b == 1) {
                            y = h;                // exit loop
                    } else switch (b) {
                        case 0:                        // end of line
                            x = 0;
                            y++;
                            p = data + (h-y-1)*bpl;
                            break;
                        case 2:                        // delta (jump)
                            {
                                quint8 tmp;
                                d->getChar((char *)&tmp);
                                x += tmp;
                                d->getChar((char *)&tmp);
                                y += tmp;
                            }

                            // Protection
                            if ((uint)x >= (uint)w)
                                x = w-1;
                            if ((uint)y >= (uint)h)
                                y = h-1;

                            p = data + (h-y-1)*bpl + x;
                            break;
                        default:                // absolute mode
                            // Protection
                            if (p + b > endp)
                                b = endp-p;

                            if (d->read((char *)p, b) != b)
                                return false;
                            if ((b & 1) == 1)
                                d->getChar(nullptr);        // align on word boundary
                            x += b;
                            p += b;
                    }
                } else {                        // encoded mode
                    // Protection
                    if (p + b > endp)
                        b = endp-p;

                    char tmp;
                    d->getChar(&tmp);
                    memset(p, tmp, b); // repeat pixel
                    x += b;
                    p += b;
                }
            }
        } else if (comp == BMP_RGB) {                // uncompressed
            while (--h >= 0) {
                if (d->read((char *)data + h*bpl, bpl) != bpl)
                    break;
            }
        }
    }

    else if (nbits == 16 || nbits == 24 || nbits == 32) { // 16,24,32 bit BMP image
        QRgb *p;
        QRgb  *end;
        uchar *buf24 = new uchar[bpl];
        int    bpl24 = ((w*nbits+31)/32)*4;
        uchar *b;
        int c;

        while (--h >= 0) {
            p = (QRgb *)(data + h*bpl);
            end = p + w;
            if (d->read((char *)buf24,bpl24) != bpl24)
                break;
            b = buf24;
            while (p < end) {
                c = *(uchar*)b | (*(uchar*)(b+1)<<8);
                if (nbits > 16)
                    c |= *(uchar*)(b+2)<<16;
                if (nbits > 24)
                    c |= *(uchar*)(b+3)<<24;
                *p++ = qRgba(apply_scale((c & red_mask) >> red_shift, red_scale),
                             apply_scale((c & green_mask) >> green_shift, green_scale),
                             apply_scale((c & blue_mask) >> blue_shift, blue_scale),
                             transp ? apply_scale((c & alpha_mask) >> alpha_shift, alpha_scale) : 0xff);
                b += nbits/8;
            }
        }
        delete[] buf24;
    }

    if (bi.biHeight < 0) {
        // Flip the image
        uchar *buf = new uchar[bpl];
        h = -bi.biHeight;
        for (int y = 0; y < h/2; ++y) {
            memcpy(buf, data + y*bpl, bpl);
            memcpy(data + y*bpl, data + (h-y-1)*bpl, bpl);
            memcpy(data + (h-y-1)*bpl, buf, bpl);
        }
        delete [] buf;
    }

    return true;
}